

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_dnd_x.cxx
# Opt level: O1

int dnd_aware(Window *window)

{
  int iVar1;
  uchar *data;
  int format;
  unsigned_long remaining;
  unsigned_long count;
  Atom actual;
  
  data = (uchar *)0x0;
  iVar1 = 0;
  XGetWindowProperty(fl_display,*window,fl_XdndAware,0,4,0,4,&actual,&format,&count,&remaining,&data
                    );
  if ((data != (uchar *)0x0 && count != 0) && (format == 0x20 && actual == 4)) {
    iVar1 = *(int *)data;
  }
  if (data != (uchar *)0x0) {
    XFree();
  }
  return iVar1;
}

Assistant:

static int dnd_aware(Window& window) {
  Atom actual; int format; unsigned long count, remaining;
  unsigned char *data = 0;
  XGetWindowProperty(fl_display, window, fl_XdndAware,
		     0, 4, False, XA_ATOM,
		     &actual, &format,
		     &count, &remaining, &data);
  int ret = 0;
  if (actual == XA_ATOM && format==32 && count && data)
    ret = int(*(Atom*)data);
  if (data) { XFree(data); data = 0; }
  return ret;
}